

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * Pathie::Path::global_config_dir(Path *__return_storage_ptr__,localpathtype local)

{
  allocator local_49;
  string local_48;
  string local_28;
  
  if ((local == LOCALPATH_LOCAL) ||
     ((local == LOCALPATH_DEFAULT && (c_localdefault == LOCALPATH_LOCAL)))) {
    std::__cxx11::string::string((string *)&local_28,"/usr/local/etc",&local_49);
    Path(__return_storage_ptr__,&local_28);
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string((string *)&local_48,"/etc",&local_49);
    Path(__return_storage_ptr__,&local_48);
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::global_config_dir(localpathtype local)
{
#if defined(_PATHIE_UNIX)
  if (local == Path::LOCALPATH_LOCAL || (local == Path::LOCALPATH_DEFAULT && get_global_dir_default() == Path::LOCALPATH_LOCAL))
    return Path("/usr/local/etc");
  else
    return Path("/etc");

#elif defined(_WIN32)
  wchar_t dir[MAX_PATH];
  HRESULT result = SHGetFolderPathW(NULL, CSIDL_SYSTEM, NULL, SHGFP_TYPE_CURRENT, dir);
  if (result != S_OK)
    throw(Pathie::WindowsHresultError(result));

  return Path(utf16_to_utf8(dir));
#else
#error Unsupported system.
#endif
}